

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_font_bake(nk_font_baker *baker,void *image_memory,int width,int height,nk_font_glyph *glyphs
                 ,int glyphs_count,nk_font_config *config_list,int font_count)

{
  nk_rune *pnVar1;
  ulong uVar2;
  nk_rune nVar3;
  short *psVar4;
  nk_font_glyph *pnVar5;
  nk_tt_packedchar *pc;
  nk_font_glyph *glyph;
  float local_c0;
  nk_tt_aligned_quad q;
  float dummy_y;
  float dummy_x;
  nk_rune codepoint;
  nk_tt_pack_range *range;
  int unscaled_line_gap;
  int unscaled_descent;
  int unscaled_ascent;
  float font_scale;
  nk_baked_font *dst_font;
  nk_font_bake_data *tmp_1;
  nk_font_config *cfg_1;
  nk_rune glyph_count;
  int char_idx;
  nk_size i;
  nk_font_bake_data *tmp;
  nk_font_config *cfg;
  nk_font_config *it;
  nk_font_config *config_iter;
  int local_30;
  nk_rune glyph_n;
  int input_i;
  int glyphs_count_local;
  nk_font_glyph *glyphs_local;
  int height_local;
  int width_local;
  void *image_memory_local;
  nk_font_baker *baker_local;
  
  local_30 = 0;
  config_iter._4_4_ = 0;
  glyph_n = glyphs_count;
  _input_i = glyphs;
  glyphs_local._0_4_ = height;
  glyphs_local._4_4_ = width;
  _height_local = image_memory;
  image_memory_local = baker;
  if (image_memory == (void *)0x0) {
    __assert_fail("image_memory",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x3232,
                  "void nk_font_bake(struct nk_font_baker *, void *, int, int, struct nk_font_glyph *, int, const struct nk_font_config *, int)"
                 );
  }
  if (width == 0) {
    __assert_fail("width",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x3233,
                  "void nk_font_bake(struct nk_font_baker *, void *, int, int, struct nk_font_glyph *, int, const struct nk_font_config *, int)"
                 );
  }
  if (height == 0) {
    __assert_fail("height",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x3234,
                  "void nk_font_bake(struct nk_font_baker *, void *, int, int, struct nk_font_glyph *, int, const struct nk_font_config *, int)"
                 );
  }
  if (config_list != (nk_font_config *)0x0) {
    if (baker == (nk_font_baker *)0x0) {
      __assert_fail("baker",
                    "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                    ,0x3236,
                    "void nk_font_bake(struct nk_font_baker *, void *, int, int, struct nk_font_glyph *, int, const struct nk_font_config *, int)"
                   );
    }
    if (font_count != 0) {
      if (glyphs_count != 0) {
        if (((((image_memory != (void *)0x0) && (width != 0)) && (height != 0)) &&
            ((config_list != (nk_font_config *)0x0 && (font_count != 0)))) &&
           ((glyphs != (nk_font_glyph *)0x0 && (glyphs_count != 0)))) {
          nk_zero(image_memory,(long)width * (long)height);
          *(void **)((long)image_memory_local + 0x38) = _height_local;
          *(int *)((long)image_memory_local + 0x24) = (int)glyphs_local;
          local_30 = 0;
          for (it = config_list; local_30 < font_count && it != (nk_font_config *)0x0; it = it->next
              ) {
            cfg = it;
            do {
              tmp = (nk_font_bake_data *)cfg;
              i = *(long *)((long)image_memory_local + 0x48) + (long)local_30 * 0x48;
              local_30 = local_30 + 1;
              nk_tt_PackSetOversampling
                        ((nk_tt_pack_context *)((long)image_memory_local + 0x18),
                         (uint)cfg->oversample_h,(uint)cfg->oversample_v);
              nk_tt_PackFontRangesRenderIntoRects
                        ((nk_tt_pack_context *)((long)image_memory_local + 0x18),(nk_tt_fontinfo *)i
                         ,*(nk_tt_pack_range **)(i + 0x38),*(int *)(i + 0x40),
                         *(nk_rp_rect **)(i + 0x30),(nk_allocator *)image_memory_local);
              cfg = cfg->n;
            } while (cfg != it);
          }
          nk_tt_PackEnd((nk_tt_pack_context *)((long)image_memory_local + 0x18),
                        (nk_allocator *)image_memory_local);
          local_30 = 0;
          for (it = config_list; local_30 < font_count && it != (nk_font_config *)0x0; it = it->next
              ) {
            cfg = it;
            do {
              _glyph_count = 0;
              cfg_1._4_4_ = 0;
              cfg_1._0_4_ = 0;
              tmp_1 = (nk_font_bake_data *)cfg;
              dst_font = (nk_baked_font *)
                         (*(long *)((long)image_memory_local + 0x48) + (long)local_30 * 0x48);
              _unscaled_ascent = cfg->font;
              local_30 = local_30 + 1;
              unscaled_descent =
                   (int)nk_tt_ScaleForPixelHeight((nk_tt_fontinfo *)dst_font,cfg->size);
              nk_tt_GetFontVMetrics
                        ((nk_tt_fontinfo *)dst_font,&unscaled_line_gap,(int *)((long)&range + 4),
                         (int *)&range);
              if (*(char *)((long)&(tmp_1->info).glyf + 1) == '\0') {
                _unscaled_ascent->ranges = (nk_rune *)tmp_1->rects;
                _unscaled_ascent->height = (float)(tmp_1->info).hmtx;
                _unscaled_ascent->ascent = (float)unscaled_line_gap * (float)unscaled_descent;
                _unscaled_ascent->descent = (float)range._4_4_ * (float)unscaled_descent;
                _unscaled_ascent->glyph_offset = config_iter._4_4_;
                _unscaled_ascent->glyph_count = 0;
              }
              for (_glyph_count = 0; uVar2 = _glyph_count, _glyph_count < (uint)dst_font[2].height;
                  _glyph_count = _glyph_count + 1) {
                pnVar1 = dst_font[1].ranges;
                for (cfg_1._4_4_ = 0; cfg_1._4_4_ < (int)pnVar1[uVar2 * 10 + 4];
                    cfg_1._4_4_ = cfg_1._4_4_ + 1) {
                  q.t1 = 0.0;
                  q.s1 = 0.0;
                  psVar4 = (short *)(*(long *)(pnVar1 + uVar2 * 10 + 6) + (long)cfg_1._4_4_ * 0x1c);
                  if (((*psVar4 != 0) || (psVar4[2] != 0)) || ((psVar4[1] != 0 || (psVar4[3] != 0)))
                     ) {
                    nVar3 = pnVar1[uVar2 * 10 + 1] + cfg_1._4_4_;
                    nk_tt_GetPackedQuad(*(nk_tt_packedchar **)(pnVar1 + uVar2 * 10 + 6),
                                        glyphs_local._4_4_,(int)glyphs_local,cfg_1._4_4_,&q.t1,&q.s1
                                        ,(nk_tt_aligned_quad *)((long)&glyph + 4),0);
                    pnVar5 = _input_i +
                             (_unscaled_ascent->glyph_offset + _unscaled_ascent->glyph_count +
                             (int)cfg_1);
                    pnVar5->codepoint = nVar3;
                    pnVar5->x0 = glyph._4_4_;
                    pnVar5->y0 = local_c0;
                    pnVar5->x1 = q.s0;
                    pnVar5->y1 = q.t0;
                    pnVar5->y0 = _unscaled_ascent->ascent + 0.5 + pnVar5->y0;
                    pnVar5->y1 = _unscaled_ascent->ascent + 0.5 + pnVar5->y1;
                    pnVar5->w = (pnVar5->x1 - pnVar5->x0) + 0.5;
                    pnVar5->h = pnVar5->y1 - pnVar5->y0;
                    if ((tmp_1->info).kern == 1) {
                      pnVar5->u0 = q.x0 * (float)glyphs_local._4_4_;
                      pnVar5->v0 = q.y0 * (float)(int)glyphs_local;
                      pnVar5->u1 = q.x1 * (float)glyphs_local._4_4_;
                      pnVar5->v1 = q.y1 * (float)(int)glyphs_local;
                    }
                    else {
                      pnVar5->u0 = q.x0;
                      pnVar5->v0 = q.y0;
                      pnVar5->u1 = q.x1;
                      pnVar5->v1 = q.y1;
                    }
                    pnVar5->xadvance = *(float *)(psVar4 + 8) + (float)(tmp_1->info).index_map;
                    if (*(char *)((long)&(tmp_1->info).glyf + 2) != '\0') {
                      pnVar5->xadvance = (float)(int)(pnVar5->xadvance + 0.5);
                    }
                    cfg_1._0_4_ = (int)cfg_1 + 1;
                  }
                }
              }
              _unscaled_ascent->glyph_count = (int)cfg_1 + _unscaled_ascent->glyph_count;
              config_iter._4_4_ = (int)cfg_1 + config_iter._4_4_;
              cfg = cfg->n;
            } while (cfg != it);
          }
        }
        return;
      }
      __assert_fail("glyphs_count",
                    "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                    ,0x3238,
                    "void nk_font_bake(struct nk_font_baker *, void *, int, int, struct nk_font_glyph *, int, const struct nk_font_config *, int)"
                   );
    }
    __assert_fail("font_count",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x3237,
                  "void nk_font_bake(struct nk_font_baker *, void *, int, int, struct nk_font_glyph *, int, const struct nk_font_config *, int)"
                 );
  }
  __assert_fail("config_list",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h",
                0x3235,
                "void nk_font_bake(struct nk_font_baker *, void *, int, int, struct nk_font_glyph *, int, const struct nk_font_config *, int)"
               );
}

Assistant:

NK_INTERN void
nk_font_bake(struct nk_font_baker *baker, void *image_memory, int width, int height,
    struct nk_font_glyph *glyphs, int glyphs_count,
    const struct nk_font_config *config_list, int font_count)
{
    int input_i = 0;
    nk_rune glyph_n = 0;
    const struct nk_font_config *config_iter;
    const struct nk_font_config *it;

    NK_ASSERT(image_memory);
    NK_ASSERT(width);
    NK_ASSERT(height);
    NK_ASSERT(config_list);
    NK_ASSERT(baker);
    NK_ASSERT(font_count);
    NK_ASSERT(glyphs_count);
    if (!image_memory || !width || !height || !config_list ||
        !font_count || !glyphs || !glyphs_count)
        return;

    /* second font pass: render glyphs */
    nk_zero(image_memory, (nk_size)((nk_size)width * (nk_size)height));
    baker->spc.pixels = (unsigned char*)image_memory;
    baker->spc.height = (int)height;
    for (input_i = 0, config_iter = config_list; input_i < font_count && config_iter;
        config_iter = config_iter->next) {
        it = config_iter;
        do {const struct nk_font_config *cfg = it;
            struct nk_font_bake_data *tmp = &baker->build[input_i++];
            nk_tt_PackSetOversampling(&baker->spc, cfg->oversample_h, cfg->oversample_v);
            nk_tt_PackFontRangesRenderIntoRects(&baker->spc, &tmp->info, tmp->ranges,
                (int)tmp->range_count, tmp->rects, &baker->alloc);
        } while ((it = it->n) != config_iter);
    } nk_tt_PackEnd(&baker->spc, &baker->alloc);

    /* third pass: setup font and glyphs */
    for (input_i = 0, config_iter = config_list; input_i < font_count && config_iter;
        config_iter = config_iter->next) {
        it = config_iter;
        do {nk_size i = 0;
            int char_idx = 0;
            nk_rune glyph_count = 0;
            const struct nk_font_config *cfg = it;
            struct nk_font_bake_data *tmp = &baker->build[input_i++];
            struct nk_baked_font *dst_font = cfg->font;

            float font_scale = nk_tt_ScaleForPixelHeight(&tmp->info, cfg->size);
            int unscaled_ascent, unscaled_descent, unscaled_line_gap;
            nk_tt_GetFontVMetrics(&tmp->info, &unscaled_ascent, &unscaled_descent,
                                    &unscaled_line_gap);

            /* fill baked font */
            if (!cfg->merge_mode) {
                dst_font->ranges = cfg->range;
                dst_font->height = cfg->size;
                dst_font->ascent = ((float)unscaled_ascent * font_scale);
                dst_font->descent = ((float)unscaled_descent * font_scale);
                dst_font->glyph_offset = glyph_n;
                // Need to zero this, or it will carry over from a previous
                // bake, and cause a segfault when accessing glyphs[].
                dst_font->glyph_count = 0;
            }

            /* fill own baked font glyph array */
            for (i = 0; i < tmp->range_count; ++i) {
                struct nk_tt_pack_range *range = &tmp->ranges[i];
                for (char_idx = 0; char_idx < range->num_chars; char_idx++)
                {
                    nk_rune codepoint = 0;
                    float dummy_x = 0, dummy_y = 0;
                    struct nk_tt_aligned_quad q;
                    struct nk_font_glyph *glyph;

                    /* query glyph bounds from stb_truetype */
                    const struct nk_tt_packedchar *pc = &range->chardata_for_range[char_idx];
                    if (!pc->x0 && !pc->x1 && !pc->y0 && !pc->y1) continue;
                    codepoint = (nk_rune)(range->first_unicode_codepoint_in_range + char_idx);
                    nk_tt_GetPackedQuad(range->chardata_for_range, (int)width,
                        (int)height, char_idx, &dummy_x, &dummy_y, &q, 0);

                    /* fill own glyph type with data */
                    glyph = &glyphs[dst_font->glyph_offset + dst_font->glyph_count + (unsigned int)glyph_count];
                    glyph->codepoint = codepoint;
                    glyph->x0 = q.x0; glyph->y0 = q.y0;
                    glyph->x1 = q.x1; glyph->y1 = q.y1;
                    glyph->y0 += (dst_font->ascent + 0.5f);
                    glyph->y1 += (dst_font->ascent + 0.5f);
                    glyph->w = glyph->x1 - glyph->x0 + 0.5f;
                    glyph->h = glyph->y1 - glyph->y0;

                    if (cfg->coord_type == NK_COORD_PIXEL) {
                        glyph->u0 = q.s0 * (float)width;
                        glyph->v0 = q.t0 * (float)height;
                        glyph->u1 = q.s1 * (float)width;
                        glyph->v1 = q.t1 * (float)height;
                    } else {
                        glyph->u0 = q.s0;
                        glyph->v0 = q.t0;
                        glyph->u1 = q.s1;
                        glyph->v1 = q.t1;
                    }
                    glyph->xadvance = (pc->xadvance + cfg->spacing.x);
                    if (cfg->pixel_snap)
                        glyph->xadvance = (float)(int)(glyph->xadvance + 0.5f);
                    glyph_count++;
                }
            }
            dst_font->glyph_count += glyph_count;
            glyph_n += glyph_count;
        } while ((it = it->n) != config_iter);
    }
}